

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

void __thiscall QMap<QString,_ParseCacheEntry>::detach(QMap<QString,_ParseCacheEntry> *this)

{
  bool bVar1;
  QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>
  *in_RDI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>_>
  *unaff_retaddr;
  QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>
  *t;
  
  t = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>_>
                      *)0x10d94c);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>_>
    ::detach(unaff_retaddr);
  }
  else {
    operator_new(0x38);
    QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>
    ::QMapData(in_RDI);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_ParseCacheEntry,_std::less<QString>,_std::allocator<std::pair<const_QString,_ParseCacheEntry>_>_>_>_>
    ::reset(unaff_retaddr,t);
  }
  return;
}

Assistant:

void detach()
    {
        if (d)
            d.detach();
        else
            d.reset(new MapData);
    }